

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
embree::LBBox<embree::Vec3fa>::LBBox(LBBox<embree::Vec3fa> *this,avector<BBox<Vec3fa>_> *bounds)

{
  long lVar1;
  BBox<embree::Vec3fa> *pBVar2;
  size_t sVar3;
  BBox<embree::Vec3fa> *pBVar4;
  Vec3fa *pVVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar18;
  float fVar19;
  undefined1 auVar17 [16];
  float fVar20;
  float fVar21;
  float fVar23;
  float fVar24;
  undefined1 auVar22 [16];
  float fVar25;
  float fVar26;
  
  sVar3 = bounds->size_active;
  pBVar4 = bounds->items;
  fVar7 = (pBVar4->lower).field_0.m128[0];
  fVar8 = (pBVar4->lower).field_0.m128[1];
  fVar9 = (pBVar4->lower).field_0.m128[2];
  fVar10 = (pBVar4->lower).field_0.m128[3];
  fVar11 = (pBVar4->upper).field_0.m128[0];
  fVar12 = (pBVar4->upper).field_0.m128[1];
  fVar13 = (pBVar4->upper).field_0.m128[2];
  fVar14 = (pBVar4->upper).field_0.m128[3];
  pBVar2 = pBVar4 + (sVar3 - 1);
  fVar16 = (pBVar2->lower).field_0.m128[0];
  fVar18 = (pBVar2->lower).field_0.m128[1];
  fVar19 = (pBVar2->lower).field_0.m128[2];
  fVar20 = (pBVar2->lower).field_0.m128[3];
  pVVar5 = &pBVar4[sVar3 - 1].upper;
  fVar21 = (pVVar5->field_0).m128[0];
  fVar23 = (pVVar5->field_0).m128[1];
  fVar24 = (pVVar5->field_0).m128[2];
  fVar25 = (pVVar5->field_0).m128[3];
  if (1 < sVar3 - 1) {
    pVVar5 = &pBVar4[1].upper;
    uVar6 = 1;
    do {
      fVar15 = (float)uVar6 / (float)(sVar3 - 1);
      fVar26 = 1.0 - fVar15;
      auVar17._0_4_ =
           (((BBox<embree::Vec3fa> *)(pVVar5 + -1))->lower).field_0.m128[0] -
           (fVar7 * fVar26 + fVar16 * fVar15);
      auVar17._4_4_ =
           (((BBox<embree::Vec3fa> *)(pVVar5 + -1))->lower).field_0.m128[1] -
           (fVar8 * fVar26 + fVar18 * fVar15);
      auVar17._8_4_ =
           (((BBox<embree::Vec3fa> *)(pVVar5 + -1))->lower).field_0.m128[2] -
           (fVar9 * fVar26 + fVar19 * fVar15);
      auVar17._12_4_ =
           (((BBox<embree::Vec3fa> *)(pVVar5 + -1))->lower).field_0.m128[3] -
           (fVar10 * fVar26 + fVar20 * fVar15);
      auVar22._0_4_ = (pVVar5->field_0).m128[0] - (fVar26 * fVar11 + fVar15 * fVar21);
      auVar22._4_4_ = (pVVar5->field_0).m128[1] - (fVar26 * fVar12 + fVar15 * fVar23);
      auVar22._8_4_ = (pVVar5->field_0).m128[2] - (fVar26 * fVar13 + fVar15 * fVar24);
      auVar22._12_4_ = (pVVar5->field_0).m128[3] - (fVar26 * fVar14 + fVar15 * fVar25);
      auVar17 = minps(auVar17,ZEXT816(0));
      auVar22 = maxps(auVar22,ZEXT816(0));
      fVar7 = fVar7 + auVar17._0_4_;
      fVar8 = fVar8 + auVar17._4_4_;
      fVar9 = fVar9 + auVar17._8_4_;
      fVar10 = fVar10 + auVar17._12_4_;
      fVar16 = auVar17._0_4_ + fVar16;
      fVar18 = auVar17._4_4_ + fVar18;
      fVar19 = auVar17._8_4_ + fVar19;
      fVar20 = auVar17._12_4_ + fVar20;
      fVar11 = fVar11 + auVar22._0_4_;
      fVar12 = fVar12 + auVar22._4_4_;
      fVar13 = fVar13 + auVar22._8_4_;
      fVar14 = fVar14 + auVar22._12_4_;
      fVar21 = auVar22._0_4_ + fVar21;
      fVar23 = auVar22._4_4_ + fVar23;
      fVar24 = auVar22._8_4_ + fVar24;
      fVar25 = auVar22._12_4_ + fVar25;
      lVar1 = uVar6 - sVar3;
      uVar6 = uVar6 + 1;
      pVVar5 = pVVar5 + 2;
    } while (lVar1 != -2);
  }
  (this->bounds0).lower.field_0.m128[0] = fVar7;
  (this->bounds0).lower.field_0.m128[1] = fVar8;
  (this->bounds0).lower.field_0.m128[2] = fVar9;
  (this->bounds0).lower.field_0.m128[3] = fVar10;
  (this->bounds0).upper.field_0.m128[0] = fVar11;
  (this->bounds0).upper.field_0.m128[1] = fVar12;
  (this->bounds0).upper.field_0.m128[2] = fVar13;
  (this->bounds0).upper.field_0.m128[3] = fVar14;
  (this->bounds1).lower.field_0.m128[0] = fVar16;
  (this->bounds1).lower.field_0.m128[1] = fVar18;
  (this->bounds1).lower.field_0.m128[2] = fVar19;
  (this->bounds1).lower.field_0.m128[3] = fVar20;
  (this->bounds1).upper.field_0.m128[0] = fVar21;
  (this->bounds1).upper.field_0.m128[1] = fVar23;
  (this->bounds1).upper.field_0.m128[2] = fVar24;
  (this->bounds1).upper.field_0.m128[3] = fVar25;
  return;
}

Assistant:

__forceinline       T* data()       { return items; }